

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O2

OPJ_BOOL opj_j2k_post_write_tile
                   (opj_j2k_t *p_j2k,opj_stream_private_t *p_stream,opj_event_mgr_t *p_manager)

{
  OPJ_UINT32 *pOVar1;
  OPJ_UINT32 OVar2;
  OPJ_BOOL OVar3;
  OPJ_SIZE_T OVar4;
  uint uVar5;
  OPJ_UINT32 OVar6;
  ulong uVar7;
  int iVar8;
  OPJ_UINT32 OVar9;
  opj_stream_private_t *p_stream_00;
  OPJ_BYTE *p_data;
  opj_event_mgr_t *poVar10;
  OPJ_UINT32 OVar11;
  OPJ_BYTE *pOVar12;
  opj_tcd *p_tile_coder;
  ulong uVar13;
  OPJ_UINT32 local_8c;
  OPJ_UINT32 local_88;
  OPJ_UINT32 local_84;
  uint local_80;
  uint local_7c;
  opj_event_mgr_t *local_78;
  opj_tcd *local_70;
  opj_j2k_t *local_68;
  OPJ_UINT32 *local_60;
  opj_tcp_t *local_58;
  opj_tcd *local_50;
  opj_stream_private_t *local_48;
  ulong local_40;
  opj_cp_t *local_38;
  
  pOVar12 = (p_j2k->m_specific_param).m_encoder.m_encoded_tile_data;
  if (pOVar12 == (OPJ_BYTE *)0x0) {
    __assert_fail("p_j2k->m_specific_param.m_encoder.m_encoded_tile_data",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x3133,
                  "OPJ_BOOL opj_j2k_post_write_tile(opj_j2k_t *, opj_stream_private_t *, opj_event_mgr_t *)"
                 );
  }
  local_88 = (p_j2k->m_specific_param).m_encoder.m_encoded_tile_size;
  p_tile_coder = p_j2k->m_tcd;
  p_tile_coder->cur_pino = 0;
  (p_j2k->m_specific_param).m_decoder.m_state = 0;
  local_84 = 0;
  local_78 = p_manager;
  OVar3 = opj_j2k_write_sot(p_j2k,pOVar12,local_88,&local_84,p_stream,p_manager);
  OVar11 = local_84;
  if (OVar3 != 0) {
    p_data = pOVar12 + local_84;
    OVar9 = local_88 - local_84;
    local_48 = p_stream;
    if ((3 < (ushort)((short)*(undefined4 *)&p_j2k->m_cp - 3U)) &&
       (((p_j2k->m_cp).tcps[p_j2k->m_current_tile_number].field_0x1638 & 4) != 0)) {
      local_84 = 0;
      local_70 = p_tile_coder;
      opj_j2k_write_poc_in_memory(p_j2k,p_data,&local_84,local_78);
      p_data = p_data + local_84;
      OVar9 = OVar9 - local_84;
      OVar11 = OVar11 + local_84;
      p_tile_coder = local_70;
    }
    p_stream_00 = local_48;
    local_84 = 0;
    OVar3 = opj_j2k_write_sod(p_j2k,p_tile_coder,p_data,&local_84,OVar9,local_48,local_78);
    if (OVar3 != 0) {
      uVar5 = OVar11 + local_84;
      opj_write_bytes_LE(pOVar12 + 6,uVar5,4);
      if ((p_j2k->m_specific_param).m_encoder.m_TLM != 0) {
        opj_j2k_update_tlm(p_j2k,uVar5);
      }
      pOVar12 = pOVar12 + uVar5;
      OVar11 = local_88 - uVar5;
      local_50 = p_j2k->m_tcd;
      local_58 = (p_j2k->m_cp).tcps;
      local_60 = (OPJ_UINT32 *)(ulong)p_j2k->m_current_tile_number;
      iVar8 = 0;
      local_40 = (ulong)uVar5;
      local_38 = &p_j2k->m_cp;
      local_80 = opj_j2k_get_num_tp(&p_j2k->m_cp,0,p_j2k->m_current_tile_number);
      pOVar1 = &(p_j2k->m_specific_param).m_encoder.m_current_tile_part_number;
      *pOVar1 = *pOVar1 + 1;
      uVar5 = 1;
      local_68 = p_j2k;
      while( true ) {
        poVar10 = local_78;
        if (local_80 <= uVar5) {
          local_60 = &local_58[(long)local_60].numpocs;
          uVar5 = 1;
          do {
            if (*local_60 < uVar5) {
              uVar7 = (ulong)(uint)((int)local_40 + iVar8);
              OVar4 = opj_stream_write_data
                                (p_stream_00,(p_j2k->m_specific_param).m_encoder.m_encoded_tile_data
                                 ,uVar7,poVar10);
              if (OVar4 == uVar7) {
                p_j2k->m_current_tile_number = p_j2k->m_current_tile_number + 1;
                return 1;
              }
              return 0;
            }
            local_50->cur_pino = uVar5;
            local_58 = (opj_tcp_t *)CONCAT44(local_58._4_4_,uVar5);
            local_80 = opj_j2k_get_num_tp(local_38,uVar5,p_j2k->m_current_tile_number);
            uVar5 = 0;
            while (local_80 != uVar5) {
              local_70 = (opj_tcd *)CONCAT44(local_70._4_4_,iVar8);
              (p_j2k->m_specific_param).m_decoder.m_state = uVar5;
              local_8c = 0;
              local_7c = uVar5;
              OVar3 = opj_j2k_write_sot(p_j2k,pOVar12,OVar11,&local_8c,p_stream_00,poVar10);
              OVar9 = local_8c;
              if (OVar3 == 0) {
                return 0;
              }
              uVar7 = (ulong)local_8c;
              OVar11 = OVar11 - local_8c;
              local_8c = 0;
              OVar3 = opj_j2k_write_sod(local_68,local_50,pOVar12 + uVar7,&local_8c,OVar11,
                                        p_stream_00,poVar10);
              p_j2k = local_68;
              OVar2 = local_8c;
              if (OVar3 == 0) {
                return 0;
              }
              uVar13 = (ulong)local_8c;
              OVar6 = local_8c + OVar9;
              local_88 = OVar11;
              opj_write_bytes_LE(pOVar12 + 6,OVar6,4);
              if ((p_j2k->m_specific_param).m_encoder.m_TLM != 0) {
                opj_j2k_update_tlm(p_j2k,OVar6);
              }
              iVar8 = (int)local_70 + OVar9 + OVar2;
              pOVar1 = &(p_j2k->m_specific_param).m_encoder.m_current_tile_part_number;
              *pOVar1 = *pOVar1 + 1;
              pOVar12 = pOVar12 + uVar7 + uVar13;
              OVar11 = local_88 - OVar2;
              p_stream_00 = local_48;
              poVar10 = local_78;
              uVar5 = local_7c + 1;
            }
            uVar5 = (int)local_58 + 1;
          } while( true );
        }
        local_70 = (opj_tcd *)CONCAT44(local_70._4_4_,iVar8);
        (p_j2k->m_specific_param).m_decoder.m_state = uVar5;
        local_8c = 0;
        local_7c = uVar5;
        OVar3 = opj_j2k_write_sot(p_j2k,pOVar12,OVar11,&local_8c,p_stream_00,local_78);
        OVar9 = local_8c;
        if (OVar3 == 0) break;
        uVar7 = (ulong)local_8c;
        OVar11 = OVar11 - local_8c;
        local_8c = 0;
        OVar3 = opj_j2k_write_sod(local_68,local_50,pOVar12 + uVar7,&local_8c,OVar11,p_stream_00,
                                  poVar10);
        p_j2k = local_68;
        OVar2 = local_8c;
        if (OVar3 == 0) {
          return 0;
        }
        uVar13 = (ulong)local_8c;
        OVar6 = local_8c + OVar9;
        local_88 = OVar11;
        opj_write_bytes_LE(pOVar12 + 6,OVar6,4);
        if ((p_j2k->m_specific_param).m_encoder.m_TLM != 0) {
          opj_j2k_update_tlm(p_j2k,OVar6);
        }
        pOVar12 = pOVar12 + uVar7 + uVar13;
        pOVar1 = &(p_j2k->m_specific_param).m_encoder.m_current_tile_part_number;
        *pOVar1 = *pOVar1 + 1;
        iVar8 = (int)local_70 + OVar9 + OVar2;
        OVar11 = local_88 - OVar2;
        uVar5 = local_7c + 1;
        p_stream_00 = local_48;
      }
    }
  }
  return 0;
}

Assistant:

static OPJ_BOOL opj_j2k_post_write_tile(opj_j2k_t * p_j2k,
                                        opj_stream_private_t *p_stream,
                                        opj_event_mgr_t * p_manager)
{
    OPJ_UINT32 l_nb_bytes_written;
    OPJ_BYTE * l_current_data = 00;
    OPJ_UINT32 l_tile_size = 0;
    OPJ_UINT32 l_available_data;

    /* preconditions */
    assert(p_j2k->m_specific_param.m_encoder.m_encoded_tile_data);

    l_tile_size = p_j2k->m_specific_param.m_encoder.m_encoded_tile_size;
    l_available_data = l_tile_size;
    l_current_data = p_j2k->m_specific_param.m_encoder.m_encoded_tile_data;

    l_nb_bytes_written = 0;
    if (! opj_j2k_write_first_tile_part(p_j2k, l_current_data, &l_nb_bytes_written,
                                        l_available_data, p_stream, p_manager)) {
        return OPJ_FALSE;
    }
    l_current_data += l_nb_bytes_written;
    l_available_data -= l_nb_bytes_written;

    l_nb_bytes_written = 0;
    if (! opj_j2k_write_all_tile_parts(p_j2k, l_current_data, &l_nb_bytes_written,
                                       l_available_data, p_stream, p_manager)) {
        return OPJ_FALSE;
    }

    l_available_data -= l_nb_bytes_written;
    l_nb_bytes_written = l_tile_size - l_available_data;

    if (opj_stream_write_data(p_stream,
                              p_j2k->m_specific_param.m_encoder.m_encoded_tile_data,
                              l_nb_bytes_written, p_manager) != l_nb_bytes_written) {
        return OPJ_FALSE;
    }

    ++p_j2k->m_current_tile_number;

    return OPJ_TRUE;
}